

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

void __thiscall
t_py_generator::generate_py_struct_required_validator
          (t_py_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  pointer pptVar5;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"def validate(self):",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar4 != pptVar5) {
    do {
      ptVar2 = *pptVar5;
      if (ptVar2->req_ == T_REQUIRED) {
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if self.",8);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is None:",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar3 = t_generator::indent(&this->super_t_generator,out);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_50,this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"raise TProtocolException(message=\'Required field ",0x31);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is unset!\')",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 != pptVar4);
  }
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_py_generator::generate_py_struct_required_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "def validate(self):" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();

  if (fields.size() > 0) {
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* field = (*f_iter);
      if (field->get_req() == t_field::T_REQUIRED) {
        indent(out) << "if self." << field->get_name() << " is None:" << endl;
        indent(out) << indent_str() << "raise TProtocolException(message='Required field "
                    << field->get_name() << " is unset!')" << endl;
      }
    }
  }

  indent(out) << "return" << endl;
  indent_down();
}